

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBSubtractRow_SSE2(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  undefined1 auVar4 [16];
  
  do {
    auVar4 = *(undefined1 (*) [16])src_argb0;
    src_argb0 = (uint8_t *)((long)src_argb0 + 0x10);
    auVar1 = *(undefined1 (*) [16])src_argb1;
    src_argb1 = (uint8_t *)((long)src_argb1 + 0x10);
    auVar4 = psubusb(auVar4,auVar1);
    *(undefined1 (*) [16])dst_argb = auVar4;
    dst_argb = (uint8_t *)((long)dst_argb + 0x10);
    iVar3 = width + -4;
    bVar2 = 3 < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar2);
  return;
}

Assistant:

void ARGBSubtractRow_SSE2(const uint8_t* src_argb0,
                          const uint8_t* src_argb1,
                          uint8_t* dst_argb,
                          int width) {
  asm volatile(
      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "lea         0x10(%0),%0                   \n"
      "movdqu      (%1),%%xmm1                   \n"
      "lea         0x10(%1),%1                   \n"
      "psubusb     %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%3                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb0),  // %0
        "+r"(src_argb1),  // %1
        "+r"(dst_argb),   // %2
        "+r"(width)       // %3
      :
      : "memory", "cc", "xmm0", "xmm1");
}